

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ClearInputCharacters(ImGuiIO *this)

{
  undefined8 in_RDI;
  
  ImVector<unsigned_short>::resize((ImVector<unsigned_short> *)this,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void ImGuiIO::ClearInputCharacters()
{
    InputQueueCharacters.resize(0);
}